

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O0

void __thiscall
ProblemFireFightingFactored::ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,
          double costOfMove,bool forcePositionRepres,double multipleAgentExtinguishProb,
          bool initialize)

{
  undefined8 uVar1;
  char *in_RCX;
  E *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte in_R8B;
  byte in_R9B;
  undefined8 in_XMM0_Qa;
  size_type in_XMM1_Qa;
  ProblemFireFightingFactored *in_stack_000003b0;
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *this_01;
  pointer_____offset_0x70___ *this_02;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [39];
  byte local_39;
  size_type local_38;
  byte local_29;
  undefined8 local_28;
  char *local_20;
  E *local_18;
  string *local_10;
  
  local_29 = in_R8B & 1;
  local_39 = in_R9B & 1;
  this_00 = in_RDI + 0x3c;
  local_38 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  this_02 = &VTT;
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d1c3d8);
  DecPOMDPInterface::DecPOMDPInterface
            ((DecPOMDPInterface *)this_00,
             &(((FactoredDecPOMDPDiscrete *)this_02)->
              super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_S._m_jointStatesMap);
  this_01 = (MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
            &in_RDI[0x3c]._M_string_length;
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)this_01,
             (void **)&(((FactoredDecPOMDPDiscrete *)this_02)->
                       super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_A._m_jointActionVec
            );
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,
             &(((FactoredDecPOMDPDiscrete *)this_02)->
              super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_S._m_stateFactors.
              super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            (this_01,&(((FactoredDecPOMDPDiscrete *)this_02)->
                      super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_A._m_jointActionVec.
                      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,
             (void **)&(((FactoredDecPOMDPDiscrete *)this_02)->
                       super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_S._m_nrStateFactors
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RSI,(allocator<char> *)in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RSI,(allocator<char> *)in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RSI,(allocator<char> *)in_RDX);
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            ((FactoredDecPOMDPDiscrete *)this_02,(void **)this_01,in_RDI,in_RSI,(string *)in_RDX);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  *(undefined8 *)in_RDI = 0xd1b700;
  *(undefined8 *)(in_RDI + 0x3c) = 0xd1bd00;
  *(undefined8 *)(in_RDI + 0x3c) = 0xd1bd00;
  *(undefined8 *)(in_RDI + 0x3c) = 0xd1bd00;
  *(undefined8 *)(in_RDI + 0x3c) = 0xd1bd00;
  *(undefined8 *)(in_RDI + 0x3c) = 0xd1bd00;
  in_RDI[0x3c]._M_string_length = 0xd1c068;
  in_RDI[0x3c]._M_string_length = 0xd1c068;
  *(undefined8 *)(in_RDI + 0x30) = 0xd1bb00;
  in_RDI[0x38]._M_string_length = (size_type)local_10;
  in_RDI[0x38].field_2._M_allocated_capacity = (size_type)local_18;
  *(char **)((long)&in_RDI[0x38].field_2 + 8) = local_20;
  *(undefined8 *)(in_RDI + 0x39) = local_28;
  *(byte *)&in_RDI[0x39]._M_string_length = local_29 & 1;
  in_RDI[0x39].field_2._M_allocated_capacity = local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x99c95e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x99c974);
  if ((0.0 <= *(double *)&in_RDI[0x39].field_2) && (*(double *)&in_RDI[0x39].field_2 <= 1.0)) {
    if ((local_39 & 1) != 0) {
      InitializePFFF(in_stack_000003b0);
    }
    return;
  }
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(in_RDX,in_RCX);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

ProblemFireFightingFactored::ProblemFireFightingFactored(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres,
        double multipleAgentExtinguishProb, bool initialize)
    :
        FactoredDecPOMDPDiscrete(
                "temp-name",
                "temp-description",
                "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres),
        _m_multipleAgentExtinguishProb(multipleAgentExtinguishProb)
{
    if(_m_multipleAgentExtinguishProb<0 ||
       _m_multipleAgentExtinguishProb>1)
           throw(E("ProblemFireFightingFactored::ctor multipleAgentExtinguishProb should be >=0 and <=1"));

    if(initialize)
        InitializePFFF();
}